

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzbdstrmatrix.cpp
# Opt level: O2

void __thiscall
TPZBlockDiagonalStructMatrix<std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>::
BlockSizes(TPZBlockDiagonalStructMatrix<std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
           *this,TPZVec<int> *blocksizes)

{
  TPZCompMesh *pTVar1;
  long lVar2;
  long lVar3;
  TPZConnect *pTVar4;
  int64_t iVar5;
  int iVar6;
  long minindex;
  long lVar7;
  TPZAdmChunkVector<TPZConnect,_10> *this_00;
  
  lVar3 = (**(code **)(*(long *)(this->super_TPZStructMatrixT<std::complex<double>_>).
                                super_TPZStructMatrix.fMesh + 0x98))();
  if (lVar3 != 0) {
    TPZSubCompMesh::PermuteExternalConnects
              ((TPZSubCompMesh *)
               (this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.fMesh);
  }
  pTVar1 = (this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.fMesh;
  lVar3 = (pTVar1->fConnectVec).super_TPZChunkVector<TPZConnect,_10>.fNElements;
  this_00 = &pTVar1->fConnectVec;
  lVar7 = 0;
  if (lVar3 < 1) {
    lVar3 = lVar7;
  }
  iVar6 = 0;
  for (; lVar3 != lVar7; lVar7 = lVar7 + 1) {
    pTVar4 = TPZChunkVector<TPZConnect,_10>::operator[]
                       (&this_00->super_TPZChunkVector<TPZConnect,_10>,lVar7);
    if ((pTVar4->fDependList == (TPZDepend *)0x0) &&
       ((pTVar4->field_2).fCompose.fIsCondensed == false)) {
      iVar6 = iVar6 + (uint)(-1 < pTVar4->fSequenceNumber);
    }
  }
  (*blocksizes->_vptr_TPZVec[3])(blocksizes,(long)iVar6);
  lVar7 = 0;
  do {
    if (lVar3 == lVar7) {
      return;
    }
    pTVar4 = TPZChunkVector<TPZConnect,_10>::operator[]
                       (&this_00->super_TPZChunkVector<TPZConnect,_10>,lVar7);
    if (((pTVar4->fDependList == (TPZDepend *)0x0) &&
        ((pTVar4->field_2).fCompose.fIsCondensed == false)) &&
       (lVar2 = pTVar4->fSequenceNumber, -1 < lVar2)) {
      iVar6 = TPZConnect::NDof(pTVar4,(this->super_TPZStructMatrixT<std::complex<double>_>).
                                      super_TPZStructMatrix.fMesh);
      minindex = (long)(((this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix
                        .fMesh)->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore[(int)lVar2].pos
      ;
      iVar5 = TPZEquationFilter::NumActive
                        (&(this->super_TPZStructMatrixT<std::complex<double>_>).
                          super_TPZStructMatrix.fEquationFilter,minindex,minindex + iVar6);
      if ((iVar5 != 0) && (iVar5 != iVar6)) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/StrMatrix/pzbdstrmatrix.cpp"
                   ,0x54);
      }
      if (iVar5 == 0) {
        iVar6 = 0;
      }
      blocksizes->fStore[lVar2] = iVar6;
    }
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

void TPZBlockDiagonalStructMatrix<TVar,TPar>::BlockSizes(TPZVec < int > & blocksizes){
    
    if(this->fMesh->FatherMesh() != 0) {
        TPZSubCompMesh *mesh = (TPZSubCompMesh *) this->fMesh;
        mesh->PermuteExternalConnects();
    }
    int nblocks = 0;
    TPZAdmChunkVector<TPZConnect> &connectvec = this->fMesh->ConnectVec();
    int64_t nc = connectvec.NElements();
    int64_t c;
    for(c=0; c<nc; c++) {
        TPZConnect &con = connectvec[c];
        if(con.HasDependency() || con.IsCondensed() || con.SequenceNumber() < 0) continue;
        nblocks++;
    }
    blocksizes.Resize(nblocks);
    int64_t bl,blsize;
    for(c=0; c<nc; c++) {
        TPZConnect &con = connectvec[c];
        if(con.HasDependency() || con.IsCondensed() || con.SequenceNumber() < 0) continue;
        bl = con.SequenceNumber();
        blsize = con.NDof(*this->fMesh);
        int64_t blpos = this->fMesh->Block().Position(bl);
        int64_t numactiv = this->fEquationFilter.NumActive(blpos, blpos+blsize);
        if (numactiv && numactiv != blsize) {
            DebugStop();
        }
        if(!numactiv)
        {
            blocksizes[bl] = 0;
        }
        else
        {
            blocksizes[bl] = blsize;
        }
    }
}